

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O1

_Bool Curl_uint_spbset_next(uint_spbset *bset,uint last,uint *pnext)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (bset != (uint_spbset *)0x0) {
    uVar5 = last + 1;
    do {
      uVar3 = (bset->head).offset;
      if ((uVar5 & 0xffffff00) <= uVar3) {
        if (uVar3 != (uVar5 & 0xffffff00)) goto LAB_00162160;
        if ((uVar5 < uVar3) || (0xff < uVar5 - uVar3)) goto LAB_00162220;
        uVar6 = uVar5 - uVar3 >> 6;
        uVar8 = (ulong)uVar6;
        uVar9 = (bset->head).slots[uVar8] >> ((byte)uVar5 & 0x3f);
        if (uVar9 != 0) {
          lVar1 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
            }
          }
          uVar5 = uVar5 + (int)lVar1;
          goto LAB_0016221c;
        }
        iVar4 = -(uVar3 + uVar6 * 0x40);
        goto LAB_00162200;
      }
      bset = (uint_spbset *)(bset->head).next;
    } while ((uint_spbset_chunk *)bset != (uint_spbset_chunk *)0x0);
  }
  bset = (uint_spbset *)0x0;
LAB_00162160:
  uVar5 = 0xffffffff;
  for (; &bset->head != (uint_spbset_chunk *)0x0;
      bset = (uint_spbset *)((uint_spbset_chunk *)&(bset->head).next)->next) {
    uVar8 = (bset->head).slots[0];
    if (uVar8 == 0) {
      uVar3 = 0;
      uVar9 = 0;
      do {
        uVar7 = uVar9;
        bVar10 = uVar7 < 3;
        if (uVar7 == 3) {
          uVar3 = 0xffffffff;
          goto LAB_001621a9;
        }
        uVar8 = (bset->head).slots[uVar7 + 1];
        uVar3 = uVar3 + 0x40;
        uVar9 = uVar7 + 1;
      } while (uVar8 == 0);
      bVar10 = uVar7 < 3;
    }
    else {
      bVar10 = true;
      uVar3 = 0;
    }
    lVar1 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar3 = ((uint)lVar1 | uVar3) + (bset->head).offset;
LAB_001621a9:
    *pnext = uVar3;
    if (bVar10) {
      return true;
    }
  }
  _Var2 = false;
LAB_001621c2:
  *pnext = uVar5;
  return _Var2;
  while( true ) {
    uVar9 = (bset->head).slots[uVar8 + 1];
    uVar8 = uVar8 + 1;
    iVar4 = iVar4 + -0x40;
    if (uVar9 != 0) break;
LAB_00162200:
    if (uVar8 == 3) goto LAB_00162220;
  }
  lVar1 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  uVar5 = (int)lVar1 - iVar4;
LAB_0016221c:
  _Var2 = true;
  goto LAB_001621c2;
LAB_00162220:
  *pnext = 0xffffffff;
  bset = (uint_spbset *)(bset->head).next;
  goto LAB_00162160;
}

Assistant:

bool Curl_uint_spbset_next(struct uint_spbset *bset, unsigned int last,
                           unsigned int *pnext)
{
  struct uint_spbset_chunk *chunk;
  unsigned int last_offset;

  ++last; /* look for the next higher number */
  last_offset = (last & ~CURL_UINT_SPBSET_CH_MASK);

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    if(chunk->offset >= last_offset) {
      break;
    }
  }

  if(chunk && (chunk->offset == last_offset)) {
    /* is there a number higher than last in this chunk? */
    if(uint_spbset_chunk_next(chunk, last, pnext))
      return TRUE;
    /* not in this chunk */
    chunk = chunk->next;
  }
  /* look for the first in the "higher" chunks, if there are any. */
  while(chunk) {
    if(uint_spbset_chunk_first(chunk, pnext))
      return TRUE;
    chunk = chunk->next;
  }
  *pnext = UINT_MAX;
  return FALSE;
}